

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O2

SPOTTYPE * board_getSpotTypes(Board *board,uchar *spotTypesCountResult)

{
  SPOTTYPE *pSVar1;
  Spot *pSVar2;
  SPOTTYPE *__ptr;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  uVar4 = 0;
  bVar5 = 0;
  __ptr = (SPOTTYPE *)0x0;
  do {
    if (board->spotsCount <= uVar4) {
      *spotTypesCountResult = bVar5;
      return __ptr;
    }
    uVar3 = 0;
    pSVar2 = board->spots[uVar4];
    do {
      if (bVar5 == uVar3) {
        bVar5 = bVar5 + 1;
        __ptr = (SPOTTYPE *)realloc(__ptr,(ulong)bVar5);
        __ptr[(ulong)bVar5 - 1] = pSVar2->type;
        break;
      }
      pSVar1 = __ptr + uVar3;
      uVar3 = uVar3 + 1;
    } while (*pSVar1 != pSVar2->type);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

SPOTTYPE * board_getSpotTypes(Board * board, unsigned char * spotTypesCountResult)
{
	unsigned char i, j, spotTypesCount=0;
	bool hasType;
	SPOTTYPE * spotTypes = 0;
	Spot * spot;

	for(i=0;i<board->spotsCount;i++)
	{
		spot = board->spots[i];
		hasType = false;
		for(j=0;j<spotTypesCount;j++)
		{
			if(spotTypes[j]==spot->type)
			{
				hasType = true;
				break;
			}
		}

		if(!hasType)
		{
			spotTypesCount++;
			// cppcheck-suppress memleakOnRealloc
			spotTypes = (SPOTTYPE *)realloc(spotTypes, sizeof(SPOTTYPE)*spotTypesCount);
			spotTypes[(spotTypesCount-1)] = spot->type;
		}
	}

	*spotTypesCountResult = spotTypesCount;

	return spotTypes;
}